

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O3

tidyLocaleMapItemImpl * prvTidygetNextWindowsLanguage(TidyIterator *iter)

{
  _html5Info *p_Var1;
  TidyIterator p_Var2;
  TidyIterator p_Var3;
  TidyIterator p_Var4;
  
  if (iter == (TidyIterator *)0x0) {
    __assert_fail("iter != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]libtidy/src/language.c"
                  ,0x241,
                  "const tidyLocaleMapItemImpl *prvTidygetNextWindowsLanguage(TidyIterator *)");
  }
  p_Var2 = *iter;
  p_Var3 = (TidyIterator)(ulong)tidyLanguageListSize_array_size;
  if (p_Var2 == (TidyIterator)0x0) {
    p_Var1 = (_html5Info *)0x0;
    p_Var2 = (TidyIterator)0x0;
  }
  else {
    if (tidyLanguageListSize_array_size == 0) {
      p_Var3 = (TidyIterator)0x0;
      do {
        tidyLanguageListSize_array_size = (int)p_Var3 + 1;
        p_Var3 = (TidyIterator)(ulong)tidyLanguageListSize_array_size;
      } while (localeMappings[(long)p_Var3].winName != (ctmbstr)0x0);
    }
    if (p_Var3 < p_Var2) {
      p_Var1 = (_html5Info *)0x0;
    }
    else {
      p_Var1 = html5Info + (long)(p_Var2 + 3);
      p_Var2 = (TidyIterator)((long)&p_Var2->_opaque + 1);
    }
  }
  if ((int)p_Var3 == 0) {
    p_Var3 = (TidyIterator)0x0;
    do {
      tidyLanguageListSize_array_size = (int)p_Var3 + 1;
      p_Var3 = (TidyIterator)(ulong)tidyLanguageListSize_array_size;
    } while (localeMappings[(long)p_Var3].winName != (ctmbstr)0x0);
  }
  p_Var4 = (TidyIterator)0x0;
  if (p_Var2 <= p_Var3) {
    p_Var4 = p_Var2;
  }
  *iter = p_Var4;
  return (tidyLocaleMapItemImpl *)p_Var1;
}

Assistant:

const tidyLocaleMapItemImpl *TY_(getNextWindowsLanguage)( TidyIterator *iter )
{
    const tidyLocaleMapItemImpl *item = NULL;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= tidyLanguageListSize() )
    {
        item = &localeMappings[ itemIndex -1 ];
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= tidyLanguageListSize() ? itemIndex : (size_t)0 );
    return item;
}